

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BlenderImporter::BuildMaterials(BlenderImporter *this,ConversionData *conv_data)

{
  ai_real aVar1;
  ai_real aVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  mywrap *pmVar9;
  size_type __n;
  reference psVar10;
  aiMaterial *paVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *tex;
  ulong local_500;
  size_t i_1;
  float local_4ec;
  float ray_mirror;
  float local_4dc;
  float har;
  undefined1 local_4cc [8];
  aiColor3D emit_col;
  aiColor3D col;
  undefined1 local_490 [8];
  aiString name;
  aiMaterial *local_80;
  aiMaterial *mout;
  size_t i;
  shared_ptr<Assimp::Blender::Material> mat;
  iterator __end1;
  iterator __begin1;
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  *__range1;
  ConversionData *conv_data_local;
  BlenderImporter *this_local;
  
  pmVar9 = Blender::TempArray<std::vector,_aiMaterial>::operator->(&conv_data->materials);
  __n = std::
        deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
        ::size(&conv_data->materials_raw);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve(pmVar9,__n);
  BuildDefaultMaterial(this,conv_data);
  std::
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  ::begin((iterator *)&__end1._M_node,&conv_data->materials_raw);
  std::
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  ::end((iterator *)
        &mat.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        &conv_data->materials_raw);
  do {
    bVar8 = std::operator!=((_Self *)&__end1._M_node,
                            (_Self *)&mat.
                                      super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    if (!bVar8) {
      return;
    }
    psVar10 = std::
              _Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
              ::operator*((_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
                           *)&__end1._M_node);
    std::shared_ptr<Assimp::Blender::Material>::shared_ptr
              ((shared_ptr<Assimp::Blender::Material> *)&i,psVar10);
    for (mout = (aiMaterial *)0x0; mout < (aiMaterial *)0x13;
        mout = (aiMaterial *)((long)&mout->mProperties + 1)) {
      conv_data->next_texture[(long)mout] = 0;
    }
    paVar11 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar11);
    local_80 = paVar11;
    pmVar9 = Blender::TempArray<std::vector,_aiMaterial>::operator->(&conv_data->materials);
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(pmVar9,&local_80);
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&col.b,(peVar12->id).name + 2,(allocator<char> *)((long)&col.g + 3));
    aiString::aiString((aiString *)local_490,(string *)&col.b);
    std::__cxx11::string::~string((string *)&col.b);
    std::allocator<char>::~allocator((allocator<char> *)((long)&col.g + 3));
    aiMaterial::AddProperty(local_80,(aiString *)local_490,"?mat.name",0,0);
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar1 = peVar12->r;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar2 = peVar12->g;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aiColor3D::aiColor3D((aiColor3D *)&emit_col.g,aVar1,aVar2,peVar12->b);
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    if ((peVar12->r != 0.0) || (NAN(peVar12->r))) {
LAB_007c686b:
      aiMaterial::AddProperty(local_80,(aiColor3D *)&emit_col.g,1,"$clr.diffuse",0,0);
      peVar12 = std::
                __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&i);
      if ((peVar12->emit != 0.0) || (NAN(peVar12->emit))) {
        peVar12 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&i);
        fVar3 = peVar12->emit;
        peVar12 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&i);
        fVar4 = peVar12->r;
        peVar12 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&i);
        fVar5 = peVar12->emit;
        peVar12 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&i);
        fVar6 = peVar12->g;
        peVar12 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&i);
        fVar7 = peVar12->emit;
        peVar12 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&i);
        aiColor3D::aiColor3D((aiColor3D *)local_4cc,fVar3 * fVar4,fVar5 * fVar6,fVar7 * peVar12->b);
        aiMaterial::AddProperty(local_80,(aiColor3D *)local_4cc,1,"$clr.emissive",0,0);
      }
    }
    else {
      peVar12 = std::
                __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&i);
      if ((peVar12->g != 0.0) || (NAN(peVar12->g))) goto LAB_007c686b;
      peVar12 = std::
                __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&i);
      if ((peVar12->b != 0.0) || (NAN(peVar12->b))) goto LAB_007c686b;
    }
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar1 = peVar12->specr;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar2 = peVar12->specg;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aiColor3D::aiColor3D((aiColor3D *)&stack0xfffffffffffffb28,aVar1,aVar2,peVar12->specb);
    aiColor3D::operator=((aiColor3D *)&emit_col.g,(aiColor3D *)&stack0xfffffffffffffb28);
    aiMaterial::AddProperty(local_80,(aiColor3D *)&emit_col.g,1,"$clr.specular",0,0);
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    if (peVar12->har != 0) {
      peVar12 = std::
                __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&i);
      local_4dc = (float)(int)peVar12->har;
      aiMaterial::AddProperty(local_80,&local_4dc,1,"$mat.shininess",0,0);
    }
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar1 = peVar12->ambr;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar2 = peVar12->ambg;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aiColor3D::aiColor3D((aiColor3D *)&stack0xfffffffffffffb18,aVar1,aVar2,peVar12->ambb);
    aiColor3D::operator=((aiColor3D *)&emit_col.g,(aiColor3D *)&stack0xfffffffffffffb18);
    aiMaterial::AddProperty(local_80,(aiColor3D *)&emit_col.g,1,"$clr.ambient",0,0);
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    if ((peVar12->mode & 0x40000U) != 0) {
      peVar12 = std::
                __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&i);
      local_4ec = peVar12->ray_mirror;
      aiMaterial::AddProperty(local_80,&local_4ec,1,"$mat.reflectivity",0,0);
    }
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar1 = peVar12->mirr;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aVar2 = peVar12->mirg;
    peVar12 = std::
              __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i);
    aiColor3D::aiColor3D((aiColor3D *)&i_1,aVar1,aVar2,peVar12->mirb);
    aiColor3D::operator=((aiColor3D *)&emit_col.g,(aiColor3D *)&i_1);
    aiMaterial::AddProperty(local_80,(aiColor3D *)&emit_col.g,1,"$clr.reflective",0,0);
    for (local_500 = 0; paVar11 = local_80, local_500 < 0x12; local_500 = local_500 + 1) {
      peVar12 = std::
                __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&i);
      bVar8 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(peVar12->mtex + local_500));
      paVar11 = local_80;
      if (bVar8) {
        peVar13 = std::__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2> *)
                             &i);
        peVar12 = std::
                  __shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&i);
        tex = std::__shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>::get
                        (&peVar12->mtex[local_500].
                          super___shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>);
        ResolveTexture(this,paVar11,peVar13,tex,conv_data);
      }
    }
    peVar13 = std::__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2> *)&i);
    AddBlendParams(this,paVar11,peVar13);
    std::shared_ptr<Assimp::Blender::Material>::~shared_ptr
              ((shared_ptr<Assimp::Blender::Material> *)&i);
    std::
    _Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
    ::operator++((_Deque_iterator<std::shared_ptr<Assimp::Blender::Material>,_std::shared_ptr<Assimp::Blender::Material>_&,_std::shared_ptr<Assimp::Blender::Material>_*>
                  *)&__end1._M_node);
  } while( true );
}

Assistant:

void BlenderImporter::BuildMaterials(ConversionData& conv_data)
{
    conv_data.materials->reserve(conv_data.materials_raw.size());

    BuildDefaultMaterial(conv_data);

    for(std::shared_ptr<Material> mat : conv_data.materials_raw) {

        // reset per material global counters
        for (size_t i = 0; i < sizeof(conv_data.next_texture)/sizeof(conv_data.next_texture[0]);++i) {
            conv_data.next_texture[i] = 0 ;
        }

        aiMaterial* mout = new aiMaterial();
        conv_data.materials->push_back(mout);
        // For any new material field handled here, the default material above must be updated with an appropriate default value.

        // set material name
        aiString name = aiString(mat->id.name+2); // skip over the name prefix 'MA'
        mout->AddProperty(&name,AI_MATKEY_NAME);

        // basic material colors
        aiColor3D col(mat->r,mat->g,mat->b);
        if (mat->r || mat->g || mat->b ) {

            // Usually, zero diffuse color means no diffuse color at all in the equation.
            // So we omit this member to express this intent.
            mout->AddProperty(&col,1,AI_MATKEY_COLOR_DIFFUSE);

            if (mat->emit) {
                aiColor3D emit_col(mat->emit * mat->r, mat->emit * mat->g, mat->emit * mat->b) ;
                mout->AddProperty(&emit_col, 1, AI_MATKEY_COLOR_EMISSIVE) ;
            }
        }

        col = aiColor3D(mat->specr,mat->specg,mat->specb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_SPECULAR);

        // is hardness/shininess set?
        if( mat->har ) {
            const float har = mat->har;
            mout->AddProperty(&har,1,AI_MATKEY_SHININESS);
        }

        col = aiColor3D(mat->ambr,mat->ambg,mat->ambb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_AMBIENT);

        // is mirror enabled?
        if( mat->mode & MA_RAYMIRROR ) {
            const float ray_mirror = mat->ray_mirror;
            mout->AddProperty(&ray_mirror,1,AI_MATKEY_REFLECTIVITY);
        }

        col = aiColor3D(mat->mirr,mat->mirg,mat->mirb);
        mout->AddProperty(&col,1,AI_MATKEY_COLOR_REFLECTIVE);

        for(size_t i = 0; i < sizeof(mat->mtex) / sizeof(mat->mtex[0]); ++i) {
            if (!mat->mtex[i]) {
                continue;
            }

            ResolveTexture(mout,mat.get(),mat->mtex[i].get(),conv_data);
        }

        AddBlendParams(mout, mat.get());
    }
}